

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

bool __thiscall
duckdb::MultiFileList::Scan
          (MultiFileList *this,MultiFileListScanData *iterator,OpenFileInfo *result_file)

{
  OpenFileInfo maybe_file;
  OpenFileInfo OStack_48;
  
  (*this->_vptr_MultiFileList[8])(&OStack_48,this,iterator->current_file_idx);
  if (OStack_48.path._M_string_length != 0) {
    OpenFileInfo::operator=(result_file,&OStack_48);
    iterator->current_file_idx = iterator->current_file_idx + 1;
  }
  OpenFileInfo::~OpenFileInfo(&OStack_48);
  return OStack_48.path._M_string_length != 0;
}

Assistant:

bool MultiFileList::Scan(MultiFileListScanData &iterator, OpenFileInfo &result_file) {
	D_ASSERT(iterator.current_file_idx != DConstants::INVALID_INDEX);
	auto maybe_file = GetFile(iterator.current_file_idx);

	if (maybe_file.path.empty()) {
		D_ASSERT(iterator.current_file_idx >= GetTotalFileCount());
		return false;
	}

	result_file = maybe_file;
	iterator.current_file_idx++;
	return true;
}